

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void map_spawn_chests(void *map_void)

{
  list<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *plVar1;
  size_t *psVar2;
  short sVar3;
  undefined2 uVar4;
  Map_Chest *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer plVar5;
  int iVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  long lVar9;
  pointer __x;
  iterator __end4;
  _List_node_base *p_Var10;
  bool bVar11;
  vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
  spawns;
  list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> slot_spawns;
  vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
  local_98;
  _List_node_base local_78;
  Map *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  _List_node_base *local_48;
  _List_node_base *local_40;
  double local_38;
  
  local_38 = Timer::GetTime();
  local_50 = *(undefined8 **)((long)map_void + 0x50);
  local_58 = *(undefined8 **)((long)map_void + 0x58);
  if (local_50 != local_58) {
    local_60 = (Map *)map_void;
    do {
      this = (Map_Chest *)*local_50;
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50[1];
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      local_98.
      super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)0x0;
      local_98.
      super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)0x0;
      local_98.
      super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
      ::resize(&local_98,(long)this->slots);
      p_Var8 = (_List_node_base *)&this->spawns;
      p_Var10 = (this->spawns).super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      if (p_Var10 != p_Var8) {
        plVar1 = &this->items;
        local_48 = p_Var8;
        do {
          plVar5 = local_98.
                   super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_78._M_next = p_Var10[1]._M_next;
          local_78._M_prev = p_Var10[1]._M_prev;
          sVar3 = *(short *)((long)&p_Var10[2]._M_next + 4);
          if ((double)(int)sVar3 * 60.0 + (double)p_Var10[2]._M_prev < local_38) {
            iVar6 = *(int *)&p_Var10[2]._M_next;
            uVar4 = *(undefined2 *)((long)&p_Var10[2]._M_next + 6);
            p_Var7 = (plVar1->super__List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_>).
                     _M_impl._M_node.super__List_node_base._M_next;
            if (p_Var7 != (_List_node_base *)plVar1) {
              bVar11 = false;
              do {
                if (*(int *)&p_Var7[1]._M_prev == iVar6) {
                  bVar11 = true;
                }
                p_Var7 = p_Var7->_M_next;
              } while (p_Var7 != (_List_node_base *)plVar1);
              if (bVar11) goto LAB_0016ee2a;
            }
            local_40 = p_Var10[2]._M_prev;
            p_Var8 = (_List_node_base *)operator_new(0x30);
            p_Var8[1]._M_next = local_78._M_next;
            p_Var8[1]._M_prev = local_78._M_prev;
            *(int *)&p_Var8[2]._M_next = iVar6;
            *(short *)((long)&p_Var8[2]._M_next + 4) = sVar3;
            *(undefined2 *)((long)&p_Var8[2]._M_next + 6) = uVar4;
            p_Var8[2]._M_prev = local_40;
            std::__detail::_List_node_base::_M_hook(p_Var8);
            psVar2 = &plVar5[iVar6 + -1].
                      super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>._M_impl.
                      _M_node._M_size;
            *psVar2 = *psVar2 + 1;
            p_Var8 = local_48;
          }
LAB_0016ee2a:
          p_Var10 = p_Var10->_M_next;
        } while (p_Var10 != p_Var8);
      }
      plVar5 = local_98.
               super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_98.
          super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_98.
          super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        bVar11 = false;
        __x = local_98.
              super__Vector_base<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        do {
          std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>::list
                    ((list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)&local_78,__x);
          p_Var8 = local_78._M_next;
          if (local_78._M_next != &local_78) {
            iVar6 = util::rand();
            lVar9 = (long)iVar6;
            bVar11 = iVar6 == 0;
            if (iVar6 < 1) {
              while (!bVar11) {
                p_Var8 = p_Var8->_M_prev;
                lVar9 = lVar9 + 1;
                bVar11 = lVar9 == 0;
              }
            }
            else {
              do {
                p_Var8 = p_Var8->_M_next;
                lVar9 = lVar9 + -1;
              } while (lVar9 != 0);
            }
            bVar11 = true;
            Map_Chest::AddItem(this,*(short *)((long)&p_Var8[1]._M_next + 4),
                               *(int *)&p_Var8[1]._M_prev,*(int *)&p_Var8[2]._M_next);
            p_Var8 = local_78._M_next;
          }
          while (p_Var8 != &local_78) {
            p_Var10 = (((_List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_> *)
                       &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
            operator_delete(p_Var8,0x30);
            p_Var8 = p_Var10;
          }
          __x = __x + 1;
        } while (__x != plVar5);
        if (bVar11) {
          Map_Chest::Update(this,local_60,(Character *)0x0);
        }
      }
      std::
      vector<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>,_std::allocator<std::__cxx11::list<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>_>_>
      ::~vector(&local_98);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      local_50 = local_50 + 2;
    } while (local_50 != local_58);
  }
  return;
}

Assistant:

void map_spawn_chests(void *map_void)
{
	Map *map(static_cast<Map *>(map_void));

	double current_time = Timer::GetTime();
	UTIL_FOREACH(map->chests, chest)
	{
		bool needs_update = false;

		std::vector<std::list<Map_Chest_Spawn>> spawns;
		spawns.resize(chest->slots);

		UTIL_FOREACH(chest->spawns, spawn)
		{
			if (spawn.last_taken + spawn.time*60.0 < current_time)
			{
				bool slot_used = false;

				UTIL_FOREACH(chest->items, item)
				{
					if (item.slot == spawn.slot)
					{
						slot_used = true;
					}
				}

				if (!slot_used)
				{
					spawns[spawn.slot - 1].emplace_back(spawn);
				}
			}
		}

		UTIL_FOREACH(spawns, slot_spawns)
		{
			if (!slot_spawns.empty())
			{
				const Map_Chest_Spawn& spawn = *std::next(slot_spawns.cbegin(), util::rand(0, slot_spawns.size() - 1));

				chest->AddItem(spawn.item.id, spawn.item.amount, spawn.slot);
				needs_update = true;

#ifdef DEBUG
				Console::Dbg("Spawning chest item %i (x%i) on map %i", spawn.item.id, spawn.item.amount, map->id);
#endif // DEBUG
			}
		}

		if (needs_update)
		{
			chest->Update(map, 0);
		}
	}
}